

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::CZString::CZString(CZString *this,CZString *other)

{
  uint local_2c;
  char *local_28;
  CZString *other_local;
  CZString *this_local;
  
  if ((((other->field_1).index_ & 3) == 0) || (other->cstr_ == (char *)0x0)) {
    local_28 = other->cstr_;
  }
  else {
    local_28 = duplicateStringValue(other->cstr_,(ulong)((other->field_1).index_ >> 2));
  }
  this->cstr_ = local_28;
  if (other->cstr_ == (char *)0x0) {
    local_2c = (other->field_1).index_ & 3;
  }
  else {
    local_2c = (uint)(((other->field_1).index_ & 3) != 0);
  }
  (this->field_1).index_ = (this->field_1).index_ & 0xfffffffc | local_2c;
  (this->field_1).index_ = (this->field_1).index_ & 3 | (other->field_1).index_ & 0xfffffffc;
  return;
}

Assistant:

Value::CZString::CZString(const CZString& other) {
  cstr_ = (other.storage_.policy_ != noDuplication && other.cstr_ != nullptr
               ? duplicateStringValue(other.cstr_, other.storage_.length_)
               : other.cstr_);
  storage_.policy_ =
      static_cast<unsigned>(
          other.cstr_
              ? (static_cast<DuplicationPolicy>(other.storage_.policy_) ==
                         noDuplication
                     ? noDuplication
                     : duplicate)
              : static_cast<DuplicationPolicy>(other.storage_.policy_)) &
      3U;
  storage_.length_ = other.storage_.length_;
}